

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_flashfader.cpp
# Opt level: O2

void __thiscall DFlashFader::Serialize(DFlashFader *this,FArchive *arc)

{
  FArchive *pFVar1;
  int i;
  uint uVar2;
  int j;
  ulong uVar3;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = FArchive::operator<<(arc,(DWORD *)&this->TotalTics);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->StartTic);
  ::operator<<(pFVar1,(AActor **)&this->ForWho);
  for (uVar2 = 1; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    for (uVar3 = 3; -1 < (int)uVar3; uVar3 = (ulong)((int)uVar3 - 1)) {
      FArchive::operator<<(arc,this->Blends[uVar2] + uVar3);
    }
  }
  return;
}

Assistant:

void DFlashFader::Serialize (FArchive &arc)
{
	Super::Serialize (arc);
	arc << TotalTics << StartTic << ForWho;
	for (int i = 1; i >= 0; --i)
		for (int j = 3; j >= 0; --j)
			arc << Blends[i][j];
}